

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O1

uint32_t miniply::triangulate_polygon(uint32_t n,float *pos,uint32_t numVerts,int *indices,int *dst)

{
  uint32_t idx;
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint32_t idx_00;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> next;
  vector<unsigned_int,_std::allocator<unsigned_int>_> prev;
  vector<miniply::Vec2,_std::allocator<miniply::Vec2>_> points2D;
  allocator_type local_ed;
  float local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined8 local_b8;
  float fStack_b0;
  float fStack_ac;
  value_type_conflict2 local_a4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  vector<miniply::Vec2,_std::allocator<miniply::Vec2>_> local_48;
  
  if (n < 3) {
    return 0;
  }
  if (n == 3) {
    *dst = *indices;
    dst[1] = indices[1];
    dst[2] = indices[2];
  }
  else {
    uVar7 = (ulong)n;
    if (n == 4) {
      *dst = *indices;
      dst[1] = indices[1];
      dst[2] = indices[3];
      dst[3] = indices[2];
      dst[4] = indices[3];
      dst[5] = indices[1];
      return 2;
    }
    if (numVerts <= (uint)*indices || *indices < 0) {
      return 0;
    }
    uVar4 = 0;
    do {
      if (uVar7 - 1 == uVar4) goto LAB_00104f80;
      lVar6 = uVar4 + 1;
      uVar4 = uVar4 + 1;
    } while ((-1 < indices[lVar6]) && ((uint)indices[lVar6] < numVerts));
    if (uVar4 < uVar7) {
      return 0;
    }
LAB_00104f80:
    local_58 = *(undefined8 *)(pos + (long)*indices * 3);
    local_d8 = (float)((ulong)local_58 >> 0x20);
    uStack_50._0_4_ = 0.0;
    uStack_50._4_4_ = 0.0;
    local_ec = pos[(long)*indices * 3 + 2];
    local_e8._0_4_ = (float)*(undefined8 *)(pos + (long)indices[1] * 3) - (float)local_58;
    local_e8._4_4_ = (float)((ulong)*(undefined8 *)(pos + (long)indices[1] * 3) >> 0x20) - local_d8;
    uStack_e0._0_4_ = 0;
    uStack_e0._4_4_ = 0;
    fVar11 = pos[(long)indices[1] * 3 + 2] - local_ec;
    fVar8 = fVar11 * fVar11 + (float)local_e8 * (float)local_e8 + local_e8._4_4_ * local_e8._4_4_;
    uStack_50 = 0;
    local_88 = local_e8._4_4_;
    fStack_84 = local_e8._4_4_;
    fStack_80 = local_e8._4_4_;
    fStack_7c = local_e8._4_4_;
    if (fVar8 < 0.0) {
      uStack_e0 = 0;
      fVar8 = sqrtf(fVar8);
      local_d8 = local_58._4_4_;
    }
    else {
      fVar8 = SQRT(fVar8);
    }
    fVar10 = (float)local_e8 / fVar8;
    local_88 = local_88 / fVar8;
    fVar11 = fVar11 / fVar8;
    uVar4 = (ulong)(n - 1);
    local_b8._0_4_ = (float)*(undefined8 *)(pos + (long)indices[uVar4] * 3) - (float)local_58;
    local_d8 = (float)((ulong)*(undefined8 *)(pos + (long)indices[uVar4] * 3) >> 0x20) - local_d8;
    local_c8 = pos[(long)indices[uVar4] * 3 + 2] - local_ec;
    fVar8 = local_c8 * local_c8 + (float)local_b8 * (float)local_b8 + local_d8 * local_d8;
    local_e8 = (int *)CONCAT44(local_e8._4_4_,fVar10);
    fStack_d4 = local_d8;
    fStack_d0 = local_d8;
    fStack_cc = local_d8;
    if (fVar8 < 0.0) {
      local_b8 = CONCAT44(local_d8,(float)local_b8);
      fStack_b0 = 0.0 - (float)uStack_50;
      fStack_ac = 0.0 - uStack_50._4_4_;
      fVar8 = sqrtf(fVar8);
      fVar10 = (float)local_e8;
    }
    else {
      fVar8 = SQRT(fVar8);
    }
    fVar12 = (float)local_b8 / fVar8;
    fVar13 = local_c8 / fVar8;
    local_c8 = local_88 * fVar13 - fVar11 * (local_d8 / fVar8);
    fVar13 = fVar11 * fVar12 - fVar13 * fVar10;
    local_b8._0_4_ = -local_88;
    local_d8 = (local_d8 / fVar8) * fVar10 - fVar12 * local_88;
    fVar8 = local_d8 * local_d8 + local_c8 * local_c8 + fVar13 * fVar13;
    fStack_c4 = fStack_84;
    fStack_c0 = fStack_80;
    fStack_bc = fStack_7c;
    if (fVar8 < 0.0) {
      local_b8 = CONCAT44(fStack_84,local_88) ^ 0x8000000080000000;
      fStack_b0 = -fStack_80;
      fStack_ac = -fStack_7c;
      fVar8 = sqrtf(fVar8);
      fVar10 = (float)local_e8;
    }
    else {
      fVar8 = SQRT(fVar8);
    }
    fVar12 = (fVar13 / fVar8) * fVar11 + (float)local_b8 * (local_d8 / fVar8);
    local_d8 = (local_d8 / fVar8) * fVar10 - fVar11 * (local_c8 / fVar8);
    local_c8 = (local_c8 / fVar8) * local_88 - fVar10 * (fVar13 / fVar8);
    fVar8 = local_c8 * local_c8 + fVar12 * fVar12 + local_d8 * local_d8;
    local_b8 = uVar7;
    if (fVar8 < 0.0) {
      fVar8 = sqrtf(fVar8);
    }
    else {
      fVar8 = SQRT(fVar8);
    }
    local_d8 = local_d8 / fVar8;
    local_c8 = local_c8 / fVar8;
    local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<miniply::Vec2,_std::allocator<miniply::Vec2>_>::vector
              (&local_48,uVar7,(value_type *)&local_a0,(allocator_type *)&local_70);
    uVar3 = (uint)local_b8;
    uVar5 = 2;
    if (2 < uVar3) {
      uVar5 = local_b8 & 0xffffffff;
    }
    lVar6 = 0;
    do {
      fVar10 = pos[(long)indices[lVar6 + 1] * 3 + 2];
      fVar13 = (float)*(undefined8 *)(pos + (long)indices[lVar6 + 1] * 3) - (float)local_58;
      fVar9 = (float)((ulong)*(undefined8 *)(pos + (long)indices[lVar6 + 1] * 3) >> 0x20) -
              local_58._4_4_;
      local_48.super__Vector_base<miniply::Vec2,_std::allocator<miniply::Vec2>_>._M_impl.
      super__Vector_impl_data._M_start[lVar6 + 1].x =
           (fVar10 - local_ec) * fVar11 + fVar13 * (float)local_e8 + local_88 * fVar9;
      local_48.super__Vector_base<miniply::Vec2,_std::allocator<miniply::Vec2>_>._M_impl.
      super__Vector_impl_data._M_start[lVar6 + 1].y =
           (fVar10 - local_ec) * local_c8 + fVar13 * (fVar12 / fVar8) + fVar9 * local_d8;
      lVar6 = lVar6 + 1;
    } while (uVar5 - 1 != lVar6);
    local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_a0,uVar7,(value_type_conflict2 *)&local_70,(allocator_type *)&local_a4);
    local_a4 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_70,uVar7,&local_a4,&local_ed);
    uVar7 = 0;
    do {
      *(int *)((long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar4 * 4) = (int)uVar7;
      *(int *)(CONCAT44(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar7 * 4) = (int)uVar4;
      uVar5 = uVar7 + 1;
      uVar4 = uVar7 & 0xffffffff;
      uVar7 = uVar5;
    } while (uVar3 + (uVar3 == 0) != uVar5);
    uVar7 = 0;
    if (uVar3 != 3) {
      local_e8 = dst;
      do {
        idx_00 = (uint32_t)uVar7;
        fVar11 = angle_at_vert(idx_00,&local_48,&local_70,&local_a0);
        uVar4 = uVar7;
        fVar8 = local_d8;
        for (idx = *(uint32_t *)
                    ((long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start + uVar7 * 4); local_d8 = fVar11,
            idx != idx_00;
            idx = *(uint32_t *)
                   ((long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start + (ulong)idx * 4)) {
          fVar8 = angle_at_vert(idx,&local_48,&local_70,&local_a0);
          fVar11 = local_d8;
          if (fVar8 < local_d8) {
            uVar4 = (ulong)idx;
            fVar11 = fVar8;
          }
          fVar8 = local_d8;
        }
        uVar3 = *(uint *)((long)local_a0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start + uVar4 * 4);
        uVar1 = *(uint *)(CONCAT44(local_70.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                                   local_70.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar4 * 4);
        *local_e8 = indices[uVar4];
        local_e8[1] = indices[uVar3];
        local_e8[2] = indices[uVar1];
        dst = local_e8 + 3;
        if ((uint32_t)uVar4 == idx_00) {
          uVar7 = (ulong)uVar3;
        }
        *(uint *)((long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start + (ulong)uVar1 * 4) = uVar3;
        *(uint *)(CONCAT44(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._0_4_) + (ulong)uVar3 * 4) =
             uVar1;
        uVar3 = (int)local_b8 - 1;
        local_b8 = (ulong)uVar3;
        local_e8 = dst;
        local_d8 = fVar8;
      } while (3 < uVar3);
    }
    *dst = indices[uVar7];
    dst[1] = indices[*(uint *)((long)local_a0.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar7 * 4)];
    pvVar2 = (void *)CONCAT44(local_70.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_70.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_4_);
    dst[2] = indices[*(uint *)((long)pvVar2 + uVar7 * 4)];
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
    if ((value_type)
        local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (value_type)0x0) {
      operator_delete(local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<miniply::Vec2,_std::allocator<miniply::Vec2>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<miniply::Vec2,_std::allocator<miniply::Vec2>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return 1;
}

Assistant:

uint32_t triangulate_polygon(uint32_t n, const float pos[], uint32_t numVerts, const int indices[], int dst[])
  {
    if (n < 3) {
      return 0;
    }
    else if (n == 3) {
      dst[0] = indices[0];
      dst[1] = indices[1];
      dst[2] = indices[2];
      return 1;
    }
    else if (n == 4) {
      dst[0] = indices[0];
      dst[1] = indices[1];
      dst[2] = indices[3];

      dst[3] = indices[2];
      dst[4] = indices[3];
      dst[5] = indices[1];
      return 2;
    }

    // Check that all indices for this face are in the valid range before we
    // try to dereference them.
    for (uint32_t i = 0; i < n; i++) {
      if (indices[i] < 0 || uint32_t(indices[i]) >= numVerts) {
        return 0;
      }
    }

    const Vec3* vpos = reinterpret_cast<const Vec3*>(pos);

    // Calculate the geometric normal of the face
    Vec3 origin = vpos[indices[0]];
    Vec3 faceU = normalize(vpos[indices[1]] - origin);
    Vec3 faceNormal = normalize(cross(faceU, normalize(vpos[indices[n - 1]] - origin)));
    Vec3 faceV = normalize(cross(faceNormal, faceU));

    // Project the faces points onto the plane perpendicular to the normal.
    std::vector<Vec2> points2D(n, Vec2{0.0f, 0.0f});
    for (uint32_t i = 1; i < n; i++) {
      Vec3 p = vpos[indices[i]] - origin;
      points2D[i] = Vec2{dot(p, faceU), dot(p, faceV)};
    }

    std::vector<uint32_t> next(n, 0u);
    std::vector<uint32_t> prev(n, 0u);
    uint32_t first = 0;
    for (uint32_t i = 0, j = n - 1; i < n; i++) {
      next[j] = i;
      prev[i] = j;
      j = i;
    }

    // Do ear clipping.
    while (n > 3) {
      // Find the (remaining) vertex with the sharpest angle.
      uint32_t bestI = first;
      float bestAngle = angle_at_vert(first, points2D, prev, next);
      for (uint32_t i = next[first]; i != first; i = next[i]) {
        float angle = angle_at_vert(i, points2D, prev, next);
        if (angle < bestAngle) {
          bestI = i;
          bestAngle = angle;
        }
      }

      // Clip the triangle at bestI.
      uint32_t nextI = next[bestI];
      uint32_t prevI = prev[bestI];

      dst[0] = indices[bestI];
      dst[1] = indices[nextI];
      dst[2] = indices[prevI];
      dst += 3;

      if (bestI == first) {
        first = nextI;
      }
      next[prevI] = nextI;
      prev[nextI] = prevI;
      --n;
    }

    // Add the final triangle.
    dst[0] = indices[first];
    dst[1] = indices[next[first]];
    dst[2] = indices[prev[first]];

    return n - 2;
  }